

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_> * __thiscall
phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
::operator=(btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
            *this,btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                  *x)

{
  if (this != x) {
    clear(this);
    btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>::
    copy_or_move_values_in_order<phmap::priv::btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>const>
              ((btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>> *)
               this,x);
  }
  return this;
}

Assistant:

auto btree<P>::operator=(const btree &x) -> btree & {
        if (this != &x) {
            clear();

            *mutable_key_comp() = x.key_comp();
            if (phmap::allocator_traits<
                allocator_type>::propagate_on_container_copy_assignment::value) {
                *mutable_allocator() = x.allocator();
            }

            copy_or_move_values_in_order(&x);
        }
        return *this;
    }